

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_user.cpp
# Opt level: O1

void __thiscall
Parser_parseValidXmlDirectlyUsingLibxml_Test::~Parser_parseValidXmlDirectlyUsingLibxml_Test
          (Parser_parseValidXmlDirectlyUsingLibxml_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseValidXmlDirectlyUsingLibxml)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\"/>\n";

    // parse the string using libcellml
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);

    // and now parse directly using libxml2
    xmlInitParser();
    xmlParserCtxtPtr context = xmlNewParserCtxt();
    xmlSetStructuredErrorFunc(context, structuredErrorCallback);
    xmlDocPtr doc = xmlCtxtReadDoc(context, reinterpret_cast<const xmlChar *>(e.c_str()), "/", nullptr, 0);
    xmlFreeParserCtxt(context);
    EXPECT_NE(nullptr, doc);
    xmlFreeDoc(doc);
    xmlSetStructuredErrorFunc(nullptr, nullptr);
    xmlCleanupParser();
}